

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Vector3 Vector3Transform(Vector3 v,Matrix mat)

{
  Vector3 VVar1;
  float fVar2;
  float z;
  float y;
  float x;
  undefined4 local_28;
  undefined4 uStack_24;
  Vector3 v_local;
  undefined4 uStack_14;
  Vector3 result;
  
  fVar2 = v.z;
  local_28 = v.x;
  uStack_24 = v.y;
  VVar1.z = mat.m10 * fVar2 + mat.m2 * local_28 + mat.m6 * uStack_24 + mat.m14;
  VVar1.x = mat.m8 * fVar2 + mat.m0 * local_28 + mat.m4 * uStack_24 + mat.m12;
  VVar1.y = mat.m9 * fVar2 + mat.m1 * local_28 + mat.m5 * uStack_24 + mat.m13;
  return VVar1;
}

Assistant:

RMDEF Vector3 Vector3Transform(Vector3 v, Matrix mat)
{
    Vector3 result = { 0 };
    float x = v.x;
    float y = v.y;
    float z = v.z;

    result.x = mat.m0*x + mat.m4*y + mat.m8*z + mat.m12;
    result.y = mat.m1*x + mat.m5*y + mat.m9*z + mat.m13;
    result.z = mat.m2*x + mat.m6*y + mat.m10*z + mat.m14;

    return result;
}